

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O1

IterateResult __thiscall
glcts::TessellationShaderQuadsDegenerateCase::iterate(TessellationShaderQuadsDegenerateCase *this)

{
  ostringstream *poVar1;
  pointer p_Var2;
  float *vertex_data;
  bool bVar3;
  TestError *pTVar4;
  NotSupportedError *this_00;
  _tessellation_shader_vertex_spacing vertex_spacing;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  _tessellation_shader_vertex_spacing vertex_spacing_01;
  ulong uVar5;
  pointer p_Var6;
  float *triangle_vertex_data;
  string vs_mode_string;
  string ref_vs_mode_string;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  p_Var2 = (this->m_runs).
           super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (p_Var6 = p_Var2;
      p_Var6 != (this->m_runs).
                super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var6 = p_Var6 + 1) {
    if (p_Var6->n_vertices != 6) {
      TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                (&local_1f0,(TessellationShaderUtils *)(ulong)p_Var6->vertex_spacing,vertex_spacing)
      ;
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Invalid number of coordinates (",0x1f);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 ", instead of 6) was generated for the following tessellation configuration: primitive mode:quads, vertex spacing mode:"
                 ,0x76);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," inner tessellation levels:",0x1b);
      std::ostream::_M_insert<double>((double)p_Var6->inner[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)p_Var6->inner[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," outer tessellation levels:",0x1b);
      std::ostream::_M_insert<double>((double)p_Var6->outer[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)p_Var6->outer[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)p_Var6->outer[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::_M_insert<double>((double)p_Var6->outer[3]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid number of coordinates was generated for at least one run",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                 ,0xf9);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (2 < p_Var2->n_vertices) {
    uVar5 = 0;
    do {
      p_Var6 = (this->m_runs).
               super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if (p_Var6 != (this->m_runs).
                    super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        triangle_vertex_data =
             (float *)((p_Var2->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + (ulong)(uint)((int)uVar5 * 9) * 4);
        do {
          vertex_data = (float *)(p_Var6->data).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
          bVar3 = TessellationShaderUtils::isTriangleDefined(triangle_vertex_data,vertex_data);
          if ((!bVar3) &&
             (bVar3 = TessellationShaderUtils::isTriangleDefined
                                (triangle_vertex_data,vertex_data + 9), !bVar3)) {
            TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                      (&local_1f0,(TessellationShaderUtils *)(ulong)p_Var2->vertex_spacing,
                       vertex_spacing_00);
            TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                      (&local_1d0,(TessellationShaderUtils *)(ulong)p_Var6->vertex_spacing,
                       vertex_spacing_01);
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "Reference run does not contain a triangle found in a base run generated for the following tessellation configuration: primitive mode:quads, base vertex spacing mode:"
                       ,0xa5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," base inner tessellation levels:",0x20);
            std::ostream::_M_insert<double>((double)p_Var2->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var2->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," base outer tessellation levels:",0x20);
            std::ostream::_M_insert<double>((double)p_Var2->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var2->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var2->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var2->outer[3]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"reference vertex spacing mode:",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," reference inner tessellation levels:",0x25);
            std::ostream::_M_insert<double>((double)p_Var6->inner[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var6->inner[1]);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," reference outer tessellation levels:",0x25);
            std::ostream::_M_insert<double>((double)p_Var6->outer[0]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var6->outer[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var6->outer[2]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::_M_insert<double>((double)p_Var6->outer[3]);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar4,"Reference run does not contain a triangle found in a base run",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderQuads.cpp"
                       ,299);
            __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          p_Var6 = p_Var6 + 1;
        } while (p_Var6 != (this->m_runs).
                           super__Vector_base<glcts::TessellationShaderQuadsDegenerateCase::_run,_std::allocator<glcts::TessellationShaderQuadsDegenerateCase::_run>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)p_Var2->n_vertices / 3);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderQuadsDegenerateCase::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize the test */
	initTest();

	/* Iterate through all runs */

	/* The test fails if any of the runs did not generate exactly 6 coordinates */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		if (run.n_vertices != (2 /* triangles */ * 3 /* vertices */))
		{
			std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of coordinates (" << run.n_vertices
							   << ", instead of 6)"
								  " was generated for the following tessellation configuration: "
								  "primitive mode:quads, "
								  "vertex spacing mode:"
							   << vs_mode_string << " inner tessellation levels:" << run.inner[0] << ", "
							   << run.inner[1] << " outer tessellation levels:" << run.outer[0] << ", " << run.outer[1]
							   << ", " << run.outer[2] << ", " << run.outer[3] << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid number of coordinates was generated for at least one run");
		}
	} /* for (all runs) */

	/* All runs should generate exactly the same set of triangles.
	 *
	 * Note: we must not assume any specific vertex ordering, so we cannot
	 *       just do a plain memcmp() here.
	 */
	const _run& base_run = *m_runs.begin();

	for (unsigned int n_triangle = 0; n_triangle < base_run.n_vertices / 3 /* vertices per triangle */; n_triangle++)
	{
		const float* base_triangle_data = (const float*)(&base_run.data[0]) +
										  3		  /* vertices per triangle */
											  * 3 /* components */
											  * n_triangle;

		for (_runs_const_iterator ref_run_iterator = m_runs.begin() + 1; ref_run_iterator != m_runs.end();
			 ref_run_iterator++)
		{
			const _run& ref_run = *ref_run_iterator;

			const float* ref_triangle_data1 = (const float*)(&ref_run.data[0]);
			const float* ref_triangle_data2 =
				(const float*)(&ref_run.data[0]) + 3 /* vertices per triangle */ * 3 /* components */;

			if (!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data1) &&
				!TessellationShaderUtils::isTriangleDefined(base_triangle_data, ref_triangle_data2))
			{
				std::string base_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(base_run.vertex_spacing);
				std::string ref_vs_mode_string =
					TessellationShaderUtils::getESTokenForVertexSpacingMode(ref_run.vertex_spacing);

				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Reference run does not contain a triangle found in a base run"
									  " generated for the following tessellation configuration: "
									  "primitive mode:quads, "
									  "base vertex spacing mode:"
								   << base_vs_mode_string << " base inner tessellation levels:" << base_run.inner[0]
								   << ", " << base_run.inner[1]
								   << " base outer tessellation levels:" << base_run.outer[0] << ", "
								   << base_run.outer[1] << ", " << base_run.outer[2] << ", " << base_run.outer[3]
								   << "reference vertex spacing mode:" << ref_vs_mode_string
								   << " reference inner tessellation levels:" << ref_run.inner[0] << ", "
								   << ref_run.inner[1] << " reference outer tessellation levels:" << ref_run.outer[0]
								   << ", " << ref_run.outer[1] << ", " << ref_run.outer[2] << ", " << ref_run.outer[3]
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Reference run does not contain a triangle found in a base run");
			}
		} /* for (all reference runs) */
	}	 /* for (all triangles) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}